

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O2

bool __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::unclipped_blit
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,uint src_x,uint src_y,uint src_w,
          uint src_h,uint dst_x,uint dst_y,image<crnlib::color_quad<unsigned_char,_int>_> *src)

{
  color_quad<unsigned_char,_int> *__dest;
  color_quad<unsigned_char,_int> *__src;
  bool bVar1;
  
  bVar1 = false;
  if ((this->m_total != 0) && (bVar1 = false, src->m_total != 0)) {
    if ((src->m_width < src_w + src_x) ||
       (((src->m_height < src_h + src_y || (this->m_width < dst_x + src_w)) ||
        (this->m_height < src_h + dst_y)))) {
      bVar1 = false;
    }
    else {
      __src = src->m_pPixels + (src_y * src->m_pitch + src_x);
      __dest = this->m_pPixels + (dst_y * this->m_pitch + dst_x);
      while (bVar1 = src_h != 0, src_h = src_h - 1, bVar1) {
        memcpy(__dest,__src,(ulong)(src_w << 2));
        __src = __src + src->m_pitch;
        __dest = __dest + this->m_pitch;
      }
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool unclipped_blit(uint src_x, uint src_y, uint src_w, uint src_h, uint dst_x, uint dst_y, const image& src) {
    if ((!is_valid()) || (!src.is_valid())) {
      CRNLIB_ASSERT(0);
      return false;
    }

    if (((src_x + src_w) > src.get_width()) || ((src_y + src_h) > src.get_height())) {
      CRNLIB_ASSERT(0);
      return false;
    }

    if (((dst_x + src_w) > get_width()) || ((dst_y + src_h) > get_height())) {
      CRNLIB_ASSERT(0);
      return false;
    }

    const color_type* pS = &src(src_x, src_y);
    color_type* pD = &(*this)(dst_x, dst_y);

    const uint bytes_to_copy = src_w * sizeof(color_type);
    for (uint i = src_h; i; i--) {
      memcpy(pD, pS, bytes_to_copy);

      pS += src.get_pitch();
      pD += get_pitch();
    }

    return true;
  }